

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

permonst * grow_up(monst *mtmp,monst *victim)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  obj *poVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  int iVar10;
  permonst *ptr;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  if (mtmp->mhp < 1) {
    return (permonst *)0x0;
  }
  ptr = mtmp->data;
  iVar2 = monsndx(ptr);
  iVar3 = little_to_big(iVar2);
  if (iVar3 == 0x161) {
    iVar3 = (*(uint *)&mtmp->field_0x60 & 1) + 0x161;
  }
  if (victim == (monst *)0x0) {
    uVar12 = mt_random();
    uVar12 = (uVar12 & 7) + 1;
    iVar10 = 0;
    uVar14 = 0x32;
    uVar5 = uVar12;
  }
  else {
    bVar9 = mtmp->m_lev;
    if (bVar9 == 0) {
      iVar10 = 4;
    }
    else if (ptr->mlet == '7') {
      iVar10 = (mtmp->mhpmax / 10) * 10 + 9;
    }
    else {
      bVar1 = is_home_elemental(&mtmp->dlevel->z,ptr);
      iVar10 = (uint)bVar9 * 0x18;
      if (bVar1 == '\0') {
        iVar10 = (uint)bVar9 * 8;
      }
    }
    iVar13 = ptr->mlevel * 3;
    uVar14 = (int)(short)iVar13 - (iVar13 >> 0x1f) >> 1;
    if ((iVar2 != iVar3) && ((int)uVar14 <= (int)mons[iVar3].mlevel)) {
      uVar14 = (int)mons[iVar3].mlevel;
    }
    bVar9 = victim->m_lev;
    uVar4 = mt_random();
    uVar5 = 0;
    uVar4 = uVar4 % (bVar9 + 1);
    uVar12 = (iVar10 + 1) - mtmp->mhpmax;
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    if ((int)(mtmp->mhpmax + uVar4 + 1) <= iVar10 + 1) {
      uVar12 = uVar4 + 1;
    }
    if (1 < uVar12) {
      uVar5 = mt_random();
      uVar5 = uVar5 % uVar12;
    }
  }
  iVar13 = uVar12 + mtmp->mhpmax;
  mtmp->mhpmax = iVar13;
  mtmp->mhp = mtmp->mhp + uVar5;
  if (iVar13 <= iVar10) {
    return ptr;
  }
  uVar12 = 0x1e;
  if (((ptr < mons + 0x159 || mons + 0x168 < ptr) && (uVar12 = 5, 4 < (int)uVar14)) &&
     (uVar12 = uVar14, 0x31 < (int)uVar14)) {
    uVar12 = ('1' < ptr->mlevel) + 0x31;
  }
  bVar9 = mtmp->m_lev + 1;
  mtmp->m_lev = bVar9;
  if ((iVar3 == iVar2) || ((int)(uint)bVar9 < (int)mons[iVar3].mlevel)) goto LAB_001beeec;
  ptr = mons + iVar3;
  if ((mvitals[iVar3].mvflags & 2) != 0) {
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar2 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(mtmp), bVar1 != '\0')))) {
      pcVar7 = mon_nam(mtmp);
      pcVar8 = mons_mname(ptr);
      pcVar8 = an(pcVar8);
      iVar2 = pronoun_gender(level,mtmp);
      pcVar11 = "expires";
      if (((mons[iVar3].mlet != '7') && (mons[iVar3].mlet != '\x16')) &&
         (((mons[iVar3].mflags2 & 2) == 0 && (pcVar11 = "dies", iVar3 == 0x33)))) {
        pcVar11 = "expires";
      }
      pline("As %s grows up into %s, %s %s!",pcVar7,pcVar8,genders[iVar2].he,pcVar11);
    }
    set_mon_data(mtmp,ptr,-1);
    mondied(mtmp);
    return (permonst *)0x0;
  }
  if (flags.verbose != '\0') {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
         (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
            || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0)))))))
         ) goto LAB_001bed28;
LAB_001becd2:
      uVar12 = *(uint *)&mtmp->field_0x60;
      if (((uVar12 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0))))
      {
        if (((uVar12 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001bed1b;
        goto LAB_001bed28;
      }
      if ((uVar12 & 0x280) != 0) goto LAB_001bed28;
LAB_001bed1b:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001bed28;
    }
    else {
      bVar1 = worm_known(level,mtmp);
      if (bVar1 != '\0') goto LAB_001becd2;
LAB_001bed28:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
              (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
              youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
          if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001bee62;
          iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          if ((iVar2 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_001bee8e;
          goto LAB_001bee72;
        }
      }
      else {
LAB_001bee62:
        if (u.uprops[0x42].intrinsic == 0) {
LAB_001bee72:
          if ((u.uprops[0x42].extrinsic == 0) && (bVar1 = match_warn_of_mon(mtmp), bVar1 == '\0'))
          goto LAB_001beec5;
        }
      }
    }
LAB_001bee8e:
    pcVar7 = y_monnam(mtmp);
    pcVar7 = upstart(pcVar7);
    pcVar8 = mons_mname(ptr);
    pcVar8 = an(pcVar8);
    pline("%s grows up into %s!",pcVar7,pcVar8);
  }
LAB_001beec5:
  set_mon_data(mtmp,ptr,1);
  newsym((int)mtmp->mx,(int)mtmp->my);
  uVar12 = (uint)mtmp->m_lev;
LAB_001beeec:
  if ((int)uVar12 < (int)(uint)mtmp->m_lev) {
    mtmp->m_lev = mtmp->m_lev - 1;
    if (mtmp->mhpmax == iVar10 + 1) {
      mtmp->mhpmax = mtmp->mhpmax + -1;
    }
  }
  if (400 < mtmp->mhpmax) {
    mtmp->mhpmax = 400;
  }
  if (mtmp->mhpmax < mtmp->mhp) {
    mtmp->mhp = mtmp->mhpmax;
  }
  return ptr;
}

Assistant:

const struct permonst *grow_up(struct monst *mtmp, /* `mtmp' might "grow up" into a bigger version */
			 struct monst *victim)
{
	int oldtype, newtype, max_increase, cur_increase,
	    lev_limit, hp_threshold;
	const struct permonst *ptr = mtmp->data;

	/* monster died after killing enemy but before calling this function */
	/* currently possible if killing a gas spore */
	if (mtmp->mhp <= 0)
	    return NULL;

	/* note:  none of the monsters with special hit point calculations
	   have both little and big forms */
	oldtype = monsndx(ptr);
	newtype = little_to_big(oldtype);
	if (newtype == PM_PRIEST && mtmp->female) newtype = PM_PRIESTESS;

	/* growth limits differ depending on method of advancement */
	if (victim) {		/* killed a monster */
	    /*
	     * The HP threshold is the maximum number of hit points for the
	     * current level; once exceeded, a level will be gained.
	     * Possible bug: if somehow the hit points are already higher
	     * than that, monster will gain a level without any increase in HP.
	     */
	    hp_threshold = mtmp->m_lev * 8;		/* normal limit */
	    if (!mtmp->m_lev)
		hp_threshold = 4;
	    else if (is_golem(ptr))	/* strange creatures */
		hp_threshold = ((mtmp->mhpmax / 10) + 1) * 10 - 1;
	    else if (is_home_elemental(&mtmp->dlevel->z, ptr))
		hp_threshold *= 3;
	    lev_limit = 3 * (int)ptr->mlevel / 2;	/* same as adj_lev() */
	    /* If they can grow up, be sure the level is high enough for that */
	    if (oldtype != newtype && mons[newtype].mlevel > lev_limit)
		lev_limit = (int)mons[newtype].mlevel;
	    /* number of hit points to gain; unlike for the player, we put
	       the limit at the bottom of the next level rather than the top */
	    max_increase = rnd((int)victim->m_lev + 1);
	    if (mtmp->mhpmax + max_increase > hp_threshold + 1)
		max_increase = max((hp_threshold + 1) - mtmp->mhpmax, 0);
	    cur_increase = (max_increase > 1) ? rn2(max_increase) : 0;
	} else {
	    /* a gain level potion or wraith corpse; always go up a level
	       unless already at maximum (49 is hard upper limit except
	       for demon lords, who start at 50 and can't go any higher) */
	    max_increase = cur_increase = rnd(8);
	    hp_threshold = 0;	/* smaller than `mhpmax + max_increase' */
	    lev_limit = 50;		/* recalc below */
	}

	mtmp->mhpmax += max_increase;
	mtmp->mhp += cur_increase;
	if (mtmp->mhpmax <= hp_threshold)
	    return ptr;		/* doesn't gain a level */

	if (is_mplayer(ptr)) lev_limit = 30;	/* same as player */
	else if (lev_limit < 5) lev_limit = 5;	/* arbitrary */
	else if (lev_limit > 49) lev_limit = (ptr->mlevel > 49 ? 50 : 49);

	if ((int)++mtmp->m_lev >= mons[newtype].mlevel && newtype != oldtype) {
	    ptr = &mons[newtype];
	    if (mvitals[newtype].mvflags & G_GENOD) {	/* allow G_EXTINCT */
		if (sensemon(mtmp))
		    pline("As %s grows up into %s, %s %s!", mon_nam(mtmp),
			an(mons_mname(ptr)), mhe(level, mtmp),
			nonliving(ptr) ? "expires" : "dies");
		set_mon_data(mtmp, ptr, -1);	/* keep mvitals[] accurate */
		mondied(mtmp);
		return NULL;
	    }
	    if (flags.verbose && canspotmon(level, mtmp)) {
		pline("%s grows up into %s!",
		      upstart(y_monnam(mtmp)), an(mons_mname(ptr)));
	    }
	    set_mon_data(mtmp, ptr, 1);		/* preserve intrinsics */
	    newsym(mtmp->mx, mtmp->my);		/* color may change */
	    lev_limit = (int)mtmp->m_lev;	/* never undo increment */
	}
	/* sanity checks */
	if ((int)mtmp->m_lev > lev_limit) {
	    mtmp->m_lev--;	/* undo increment */
	    /* HP might have been allowed to grow when it shouldn't */
	    if (mtmp->mhpmax == hp_threshold + 1) mtmp->mhpmax--;
	}
	if (mtmp->mhpmax > 50*8) mtmp->mhpmax = 50*8;	  /* absolute limit */
	if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;

	return ptr;
}